

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall Loop::SetImplicitCallFlags(Loop *this,ImplicitCallFlags newFlags)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Loop *local_20;
  Loop *current;
  ImplicitCallFlags newFlags_local;
  Loop *this_local;
  
  local_20 = this;
  current._7_1_ = newFlags;
  while ((local_20->implicitCallFlags & current._7_1_) != current._7_1_) {
    current._7_1_ = this->implicitCallFlags | current._7_1_;
    local_20->implicitCallFlags = current._7_1_;
    local_20 = local_20->parent;
    if (local_20 == (Loop *)0x0) {
      return;
    }
  }
  local_20 = local_20->parent;
  do {
    if (local_20 == (Loop *)0x0) {
      return;
    }
    if ((local_20->implicitCallFlags & current._7_1_) != current._7_1_) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xdf2,"((current->implicitCallFlags & newFlags) == newFlags)",
                         "(current->implicitCallFlags & newFlags) == newFlags");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    local_20 = local_20->parent;
  } while( true );
}

Assistant:

void
Loop::SetImplicitCallFlags(Js::ImplicitCallFlags newFlags)
{
    Loop * current = this;
    do
    {
        if ((current->implicitCallFlags & newFlags) == newFlags)
        {
#if DBG
            current = current->parent;
            while (current)
            {
                Assert((current->implicitCallFlags & newFlags) == newFlags);
                current = current->parent;
            }
#endif
            break;
        }
        newFlags = (Js::ImplicitCallFlags)(implicitCallFlags | newFlags);
        current->implicitCallFlags = newFlags;
        current = current->parent;
    }
    while (current != nullptr);
}